

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Generators::GeneratorTracker::~GeneratorTracker(GeneratorTracker *this)

{
  GeneratorTracker *this_local;
  
  (this->super_TrackerBase).super_ITracker._vptr_ITracker =
       (_func_int **)&PTR__GeneratorTracker_0025f050;
  (this->super_IGeneratorTracker)._vptr_IGeneratorTracker =
       (_func_int **)&PTR__GeneratorTracker_0025f0f8;
  clara::std::
  unique_ptr<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
  ::~unique_ptr(&this->m_generator);
  IGeneratorTracker::~IGeneratorTracker(&this->super_IGeneratorTracker);
  TestCaseTracking::TrackerBase::~TrackerBase(&this->super_TrackerBase);
  return;
}

Assistant:

GeneratorTracker::~GeneratorTracker() {}